

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<char>::swap(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  reference __a;
  reference __b;
  iterator pcVar4;
  iterator pcVar5;
  iterator pcVar6;
  size_t sVar7;
  size_t EltDiff_1;
  size_t EltDiff;
  size_type i;
  size_t NumShared;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<char,_void>::isSmall
                      ((SmallVectorTemplateCommon<char,_void> *)this);
    if ((bVar1) ||
       (bVar1 = SmallVectorTemplateCommon<char,_void>::isSmall
                          ((SmallVectorTemplateCommon<char,_void> *)RHS), bVar1)) {
      sVar2 = SmallVectorBase::size((SmallVectorBase *)RHS);
      sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar3 < sVar2) {
        sVar2 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorTemplateBase<char,_true>::grow
                  (&this->super_SmallVectorTemplateBase<char,_true>,sVar2);
      }
      sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
      sVar3 = SmallVectorBase::capacity((SmallVectorBase *)RHS);
      if (sVar3 < sVar2) {
        sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
        SmallVectorTemplateBase<char,_true>::grow
                  (&RHS->super_SmallVectorTemplateBase<char,_true>,sVar2);
      }
      i = SmallVectorBase::size((SmallVectorBase *)this);
      sVar2 = SmallVectorBase::size((SmallVectorBase *)RHS);
      if (sVar2 < i) {
        i = SmallVectorBase::size((SmallVectorBase *)RHS);
      }
      for (EltDiff = 0; EltDiff != i; EltDiff = EltDiff + 1) {
        __a = SmallVectorTemplateCommon<char,_void>::operator[]
                        ((SmallVectorTemplateCommon<char,_void> *)this,EltDiff);
        __b = SmallVectorTemplateCommon<char,_void>::operator[]
                        ((SmallVectorTemplateCommon<char,_void> *)RHS,EltDiff);
        std::swap<char>(__a,__b);
      }
      sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
      sVar3 = SmallVectorBase::size((SmallVectorBase *)RHS);
      if (sVar3 < sVar2) {
        sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
        sVar3 = SmallVectorBase::size((SmallVectorBase *)RHS);
        pcVar4 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        pcVar5 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        pcVar6 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)RHS);
        SmallVectorTemplateBase<char,true>::uninitialized_copy<char,char>
                  (pcVar4 + i,pcVar5,pcVar6,(type *)0x0);
        sVar7 = SmallVectorBase::size((SmallVectorBase *)RHS);
        SmallVectorBase::set_size((SmallVectorBase *)RHS,sVar7 + (sVar2 - sVar3));
        pcVar4 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        pcVar5 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        SmallVectorTemplateBase<char,_true>::destroy_range(pcVar4 + i,pcVar5);
        SmallVectorBase::set_size((SmallVectorBase *)this,i);
      }
      else {
        sVar2 = SmallVectorBase::size((SmallVectorBase *)RHS);
        sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
        if (sVar3 < sVar2) {
          sVar2 = SmallVectorBase::size((SmallVectorBase *)RHS);
          sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
          pcVar4 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar5 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar6 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)this);
          SmallVectorTemplateBase<char,true>::uninitialized_copy<char,char>
                    (pcVar4 + i,pcVar5,pcVar6,(type *)0x0);
          sVar7 = SmallVectorBase::size((SmallVectorBase *)this);
          SmallVectorBase::set_size((SmallVectorBase *)this,sVar7 + (sVar2 - sVar3));
          pcVar4 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar5 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          SmallVectorTemplateBase<char,_true>::destroy_range(pcVar4 + i,pcVar5);
          SmallVectorBase::set_size((SmallVectorBase *)RHS,i);
        }
      }
    }
    else {
      std::swap<void*>((void **)this,(void **)RHS);
      std::swap<unsigned_int>
                (&(this->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size,
                 &(RHS->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size);
      std::swap<unsigned_int>
                (&(this->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity,
                 &(RHS->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity);
    }
  }
  return;
}

Assistant:

void SmallVectorImpl<T>::swap(SmallVectorImpl<T> &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither vector is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->BeginX, RHS.BeginX);
    std::swap(this->Size, RHS.Size);
    std::swap(this->Capacity, RHS.Capacity);
    return;
  }
  if (RHS.size() > this->capacity())
    this->grow(RHS.size());
  if (this->size() > RHS.capacity())
    RHS.grow(this->size());

  // Swap the shared elements.
  size_t NumShared = this->size();
  if (NumShared > RHS.size()) NumShared = RHS.size();
  for (size_type i = 0; i != NumShared; ++i)
    std::swap((*this)[i], RHS[i]);

  // Copy over the extra elts.
  if (this->size() > RHS.size()) {
    size_t EltDiff = this->size() - RHS.size();
    this->uninitialized_copy(this->begin()+NumShared, this->end(), RHS.end());
    RHS.set_size(RHS.size() + EltDiff);
    this->destroy_range(this->begin()+NumShared, this->end());
    this->set_size(NumShared);
  } else if (RHS.size() > this->size()) {
    size_t EltDiff = RHS.size() - this->size();
    this->uninitialized_copy(RHS.begin()+NumShared, RHS.end(), this->end());
    this->set_size(this->size() + EltDiff);
    this->destroy_range(RHS.begin()+NumShared, RHS.end());
    RHS.set_size(NumShared);
  }
}